

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cpp
# Opt level: O0

Wtxid * __thiscall CTransaction::ComputeWitnessHash(CTransaction *this)

{
  bool bVar1;
  HashWriter *in_RSI;
  CTransaction *in_RDI;
  long in_FS_OFFSET;
  CTransaction *in_stack_ffffffffffffff38;
  CTransaction *this_00;
  undefined1 local_90 [136];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  bVar1 = HasWitness(in_stack_ffffffffffffff38);
  if (bVar1) {
    memset(local_90,0,0x68);
    HashWriter::HashWriter((HashWriter *)in_stack_ffffffffffffff38);
    TransactionSerParams::operator()((TransactionSerParams *)this_00,in_RDI);
    HashWriter::operator<<
              ((HashWriter *)this_00,
               (ParamsWrapper<TransactionSerParams,_const_CTransaction> *)in_RDI);
    HashWriter::GetHash(in_RSI);
    transaction_identifier<true>::FromUint256((uint256 *)in_stack_ffffffffffffff38);
  }
  else {
    transaction_identifier<false>::ToUint256
              ((transaction_identifier<false> *)in_stack_ffffffffffffff38);
    transaction_identifier<true>::FromUint256((uint256 *)in_stack_ffffffffffffff38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (Wtxid *)this_00;
  }
  __stack_chk_fail();
}

Assistant:

Wtxid CTransaction::ComputeWitnessHash() const
{
    if (!HasWitness()) {
        return Wtxid::FromUint256(hash.ToUint256());
    }

    return Wtxid::FromUint256((HashWriter{} << TX_WITH_WITNESS(*this)).GetHash());
}